

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

string_view __thiscall
libtorrent::bdecode_node::list_string_value_at(bdecode_node *this,int i,string_view default_val)

{
  type_t tVar1;
  undefined1 local_78 [8];
  bdecode_node n;
  int i_local;
  bdecode_node *this_local;
  string_view default_val_local;
  
  n._60_4_ = i;
  list_at((bdecode_node *)local_78,this,i);
  tVar1 = type((bdecode_node *)local_78);
  if (tVar1 == string_t) {
    default_val = string_value((bdecode_node *)local_78);
  }
  ~bdecode_node((bdecode_node *)local_78);
  return default_val;
}

Assistant:

string_view bdecode_node::list_string_value_at(int i
		, string_view default_val) const
	{
		bdecode_node const n = list_at(i);
		if (n.type() != bdecode_node::string_t) return default_val;
		return n.string_value();
	}